

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O0

DUMB_IT_SIGDATA * it_riff_amff_load_sigdata(DUMBFILE *f,riff *stream)

{
  char cVar1;
  int iVar2;
  int32 iVar3;
  uint uVar4;
  int iVar5;
  DUMB_IT_SIGDATA *__ptr;
  IT_PATTERN *pIVar6;
  IT_SAMPLE *pIVar7;
  uchar *puVar8;
  int *in_RSI;
  uint size_1;
  IT_SAMPLE *sample_1;
  riff_chunk *c_2;
  IT_SAMPLE *sample;
  riff_chunk *c_1;
  int sep;
  uint size;
  riff_chunk *c;
  int found;
  int p;
  int o;
  int n;
  DUMB_IT_SIGDATA *sigdata;
  IT_SAMPLE *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int32 in_stack_ffffffffffffff9c;
  IT_SAMPLE *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  int *ptr;
  IT_SAMPLE *in_stack_ffffffffffffffb0;
  IT_SAMPLE *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int32 in_stack_ffffffffffffffc4;
  IT_PATTERN *in_stack_ffffffffffffffc8;
  uint local_30;
  int local_28;
  uint local_24;
  
  if (((in_RSI != (int *)0x0) && (*in_RSI == 0x414d4646)) &&
     (__ptr = (DUMB_IT_SIGDATA *)malloc(0x138), __ptr != (DUMB_IT_SIGDATA *)0x0)) {
    __ptr->n_patterns = 0;
    __ptr->n_samples = 0;
    __ptr->name[0] = '\0';
    local_30 = 0;
    for (local_24 = 0; local_24 < (uint)in_RSI[1]; local_24 = local_24 + 1) {
      in_stack_ffffffffffffffc8 = (IT_PATTERN *)(*(long *)(in_RSI + 2) + (long)(int)local_24 * 0x18)
      ;
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffffc8->n_rows;
      if (in_stack_ffffffffffffff98 == 0x494e5354) {
        if ((*(uint *)&in_stack_ffffffffffffffc8->entry < 0xe1) ||
           (iVar2 = dumbfile_seek((DUMBFILE *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  (long)in_stack_ffffffffffffff88,0), iVar2 != 0))
        goto LAB_009ab224;
        iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
        if (__ptr->n_samples <= iVar2) {
          __ptr->n_samples = iVar2 + 1;
        }
        if ((0x120 < *(uint *)&in_stack_ffffffffffffffc8->entry) &&
           ((iVar2 = dumbfile_seek((DUMBFILE *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (long)in_stack_ffffffffffffff88,0), iVar2 != 0 ||
            ((iVar3 = dumbfile_mgetl((DUMBFILE *)in_stack_ffffffffffffff88), iVar3 == 0x53414d50 &&
             (in_stack_ffffffffffffffc4 = dumbfile_igetl((DUMBFILE *)in_stack_ffffffffffffff88),
             *(uint *)&in_stack_ffffffffffffffc8->entry < in_stack_ffffffffffffffc4 + 0xe9U))))))
        goto LAB_009ab224;
      }
      else if (in_stack_ffffffffffffff98 == 0x4d41494e) {
        if (((local_30 & 1) != 0) || (*(uint *)&in_stack_ffffffffffffffc8->entry < 0x48))
        goto LAB_009ab224;
        local_30 = local_30 | 1;
      }
      else if (in_stack_ffffffffffffff98 == 0x4f524452) {
        if (((local_30 & 2) != 0) || (*(int *)&in_stack_ffffffffffffffc8->entry == 0))
        goto LAB_009ab224;
        local_30 = local_30 | 2;
      }
      else if (in_stack_ffffffffffffff98 == 0x50415454) {
        iVar2 = dumbfile_seek((DUMBFILE *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              (long)in_stack_ffffffffffffff88,0);
        if (iVar2 != 0) goto LAB_009ab224;
        iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
        if (__ptr->n_patterns <= iVar2) {
          __ptr->n_patterns = iVar2 + 1;
        }
        iVar3 = dumbfile_igetl((DUMBFILE *)in_stack_ffffffffffffff88);
        if (*(uint *)&in_stack_ffffffffffffffc8->entry < iVar3 + 5U) goto LAB_009ab224;
      }
    }
    if ((((local_30 == 3) && (__ptr->n_samples != 0)) && (__ptr->n_patterns != 0)) &&
       ((__ptr->n_samples < 0x100 && (__ptr->n_patterns < 0x100)))) {
      __ptr->song_message = (uchar *)0x0;
      __ptr->order = (uchar *)0x0;
      __ptr->instrument = (IT_INSTRUMENT *)0x0;
      __ptr->sample = (IT_SAMPLE *)0x0;
      __ptr->pattern = (IT_PATTERN *)0x0;
      __ptr->midi = (IT_MIDI *)0x0;
      __ptr->checkpoint = (IT_CHECKPOINT *)0x0;
      __ptr->mixing_volume = 0x30;
      __ptr->pan_separation = 0x80;
      __ptr->n_instruments = 0;
      __ptr->n_orders = 0;
      __ptr->restart_position = '\0';
      memset(__ptr->channel_volume,0x40,0x40);
      for (local_24 = 0; (int)local_24 < 0x40; local_24 = local_24 + 4) {
        in_stack_ffffffffffffffc0 = (dumb_it_default_panning_separation << 5) / 100;
        cVar1 = (char)in_stack_ffffffffffffffc0;
        __ptr->channel_pan[(int)local_24] = ' ' - cVar1;
        __ptr->channel_pan[(int)(local_24 + 1)] = cVar1 + ' ';
        __ptr->channel_pan[(int)(local_24 + 2)] = cVar1 + ' ';
        __ptr->channel_pan[(int)(local_24 + 3)] = ' ' - cVar1;
      }
      for (local_24 = 0; local_24 < (uint)in_RSI[1]; local_24 = local_24 + 1) {
        in_stack_ffffffffffffffb8 =
             (IT_SAMPLE *)(*(long *)(in_RSI + 2) + (long)(int)local_24 * 0x18);
        if (*(int *)in_stack_ffffffffffffffb8->name == 0x4d41494e) {
          iVar2 = dumbfile_seek((DUMBFILE *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                (long)in_stack_ffffffffffffff88,0);
          if (iVar2 != 0) goto LAB_009ab218;
          dumbfile_getnc(in_stack_ffffffffffffffa8,(int32)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                         ,(DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
          ;
          __ptr->name[0x40] = '\0';
          __ptr->flags = 0x131;
          uVar4 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
          if ((uVar4 & 1) == 0) {
            __ptr->flags = __ptr->flags | 8;
          }
          if (((uVar4 & 0xfffffffc) != 0) || ((uVar4 & 2) == 0)) goto LAB_009ab218;
          iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
          __ptr->n_pchannels = iVar2;
          iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
          __ptr->speed = iVar2;
          iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
          __ptr->tempo = iVar2;
          dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
          __ptr->global_volume = iVar2;
          if (*(uint *)(in_stack_ffffffffffffffb8->name + 8) < __ptr->n_pchannels + 0x48U)
          goto LAB_009ab218;
          for (local_28 = 0; local_28 < __ptr->n_pchannels; local_28 = local_28 + 1) {
            iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
            __ptr->channel_pan[local_28] = (uchar)iVar2;
            if (0x7f < iVar2) {
              __ptr->channel_volume[local_28] = '\0';
            }
          }
        }
      }
      pIVar6 = (IT_PATTERN *)malloc((long)__ptr->n_patterns << 4);
      __ptr->pattern = pIVar6;
      if (__ptr->pattern != (IT_PATTERN *)0x0) {
        for (local_24 = 0; (int)local_24 < __ptr->n_patterns; local_24 = local_24 + 1) {
          __ptr->pattern[(int)local_24].entry = (IT_ENTRY *)0x0;
        }
        pIVar7 = (IT_SAMPLE *)malloc((long)__ptr->n_samples * 0x68);
        __ptr->sample = pIVar7;
        if (__ptr->sample != (IT_SAMPLE *)0x0) {
          for (local_24 = 0; (int)local_24 < __ptr->n_samples; local_24 = local_24 + 1) {
            in_stack_ffffffffffffffb0 = __ptr->sample + (int)local_24;
            in_stack_ffffffffffffffb0->data = (void *)0x0;
            in_stack_ffffffffffffffb0->flags = '\0';
            in_stack_ffffffffffffffb0->name[0] = '\0';
          }
          local_24 = 0;
          do {
            if ((uint)in_RSI[1] <= local_24) {
              _dumb_it_fix_invalid_orders
                        ((DUMB_IT_SIGDATA *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
              return __ptr;
            }
            ptr = (int *)(*(long *)(in_RSI + 2) + (long)(int)local_24 * 0x18);
            iVar2 = *ptr;
            if (iVar2 == 0x494e5354) {
              iVar5 = dumbfile_seek((DUMBFILE *)CONCAT44(0x494e5354,in_stack_ffffffffffffff90),
                                    (long)in_stack_ffffffffffffff88,0);
              if (iVar5 != 0) break;
              in_stack_ffffffffffffff88 = __ptr->sample;
              iVar5 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff88 + iVar5;
              if (0x120 < (uint)ptr[2]) {
                iVar5 = dumbfile_seek((DUMBFILE *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                                      (long)in_stack_ffffffffffffff88,0);
                if (iVar5 != 0) break;
                iVar3 = dumbfile_mgetl((DUMBFILE *)in_stack_ffffffffffffff88);
                if (iVar3 == 0x53414d50) {
                  in_stack_ffffffffffffff9c = dumbfile_igetl((DUMBFILE *)in_stack_ffffffffffffff88);
                  iVar2 = it_riff_am_process_sample
                                    (in_stack_ffffffffffffffb8,(DUMBFILE *)in_stack_ffffffffffffffb0
                                     ,(int)((ulong)ptr >> 0x20),(int)ptr);
                  if (iVar2 == 0) goto LAB_009ab1f0;
                  break;
                }
              }
              dumbfile_seek((DUMBFILE *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                            (long)in_stack_ffffffffffffff88,0);
              dumbfile_getnc((char *)ptr,(int32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                             (DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
              in_stack_ffffffffffffffa0->name[0x1c] = '\0';
            }
            else if (iVar2 == 0x4f524452) {
              iVar2 = dumbfile_seek((DUMBFILE *)CONCAT44(0x4f524452,in_stack_ffffffffffffff90),
                                    (long)in_stack_ffffffffffffff88,0);
              if (iVar2 != 0) break;
              iVar2 = dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
              __ptr->n_orders = iVar2 + 1;
              if ((uint)ptr[2] < __ptr->n_orders + 1U) break;
              puVar8 = (uchar *)malloc((long)__ptr->n_orders);
              __ptr->order = puVar8;
              if (__ptr->order == (uchar *)0x0) break;
              dumbfile_getnc((char *)ptr,(int32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                             (DUMBFILE *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
            }
            else if (iVar2 == 0x50415454) {
              iVar2 = dumbfile_seek((DUMBFILE *)CONCAT44(0x50415454,in_stack_ffffffffffffff90),
                                    (long)in_stack_ffffffffffffff88,0);
              if (iVar2 != 0) break;
              dumbfile_getc((DUMBFILE *)in_stack_ffffffffffffff88);
              dumbfile_igetl((DUMBFILE *)in_stack_ffffffffffffff88);
              iVar2 = it_riff_am_process_pattern
                                (in_stack_ffffffffffffffc8,
                                 (DUMBFILE *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                 (int)in_stack_ffffffffffffffb8);
              if (iVar2 != 0) break;
            }
LAB_009ab1f0:
            local_24 = local_24 + 1;
          } while( true );
        }
      }
LAB_009ab218:
      _dumb_it_unload_sigdata(in_stack_ffffffffffffffa0);
    }
    else {
LAB_009ab224:
      free(__ptr);
    }
  }
  return (DUMB_IT_SIGDATA *)0x0;
}

Assistant:

static DUMB_IT_SIGDATA *it_riff_amff_load_sigdata( DUMBFILE * f, struct riff * stream )
{
	DUMB_IT_SIGDATA *sigdata;

    int n, o, p, found;

	if ( ! stream ) goto error;

	if ( stream->type != DUMB_ID( 'A', 'M', 'F', 'F' ) ) goto error;

	sigdata = malloc( sizeof( *sigdata ) );
	if ( ! sigdata ) goto error;

	sigdata->n_patterns = 0;
	sigdata->n_samples = 0;
	sigdata->name[0] = 0;

	found = 0;

	for ( n = 0; (unsigned)n < stream->chunk_count; ++n )
	{
		struct riff_chunk * c = stream->chunks + n;
		switch( c->type )
		{
		case DUMB_ID( 'M', 'A', 'I', 'N' ):
			/* initialization data */
			if ( ( found & 1 ) || ( c->size < 0x48 ) ) goto error_sd;
			found |= 1;
			break;

		case DUMB_ID( 'O', 'R', 'D', 'R' ):
			if ( ( found & 2 ) || ( c->size < 1 ) ) goto error_sd;
			found |= 2;
			break;

        case DUMB_ID( 'P', 'A', 'T', 'T' ):
            if ( dumbfile_seek( f, c->offset, DFS_SEEK_SET ) ) goto error_sd;
            o = dumbfile_getc( f );
            if ( o >= sigdata->n_patterns ) sigdata->n_patterns = o + 1;
            o = dumbfile_igetl( f );
            if ( (unsigned)o + 5 > c->size ) goto error_sd;
			break;

		case DUMB_ID( 'I', 'N', 'S', 'T' ):
			{
				if ( c->size < 0xE1 ) goto error_sd;
                if ( dumbfile_seek( f, c->offset + 1, DFS_SEEK_SET ) ) goto error_sd;
                o = dumbfile_getc( f );
                if ( o >= sigdata->n_samples ) sigdata->n_samples = o + 1;
                if ( c->size >= 0x121 )
                {
                    if ( dumbfile_seek( f, c->offset + 0xE1, DFS_SEEK_SET ) ) goto error_sd;
                    if ( dumbfile_mgetl( f ) == DUMB_ID('S','A','M','P') )
                    {
                        unsigned size = dumbfile_igetl( f );
                        if ( size + 0xE1 + 8 > c->size ) goto error_sd;
                    }
				}
			}
			break;
		}
	}

	if ( found != 3 || !sigdata->n_samples || !sigdata->n_patterns ) goto error_sd;

	if ( sigdata->n_samples > 255 || sigdata->n_patterns > 255 ) goto error_sd;

	sigdata->song_message = NULL;
	sigdata->order = NULL;
	sigdata->instrument = NULL;
	sigdata->sample = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

	sigdata->mixing_volume = 48;
	sigdata->pan_separation = 128;

	sigdata->n_instruments = 0;
	sigdata->n_orders = 0;
	sigdata->restart_position = 0;

	memset(sigdata->channel_volume, 64, DUMB_IT_N_CHANNELS);

	for (n = 0; n < DUMB_IT_N_CHANNELS; n += 4) {
		int sep = 32 * dumb_it_default_panning_separation / 100;
		sigdata->channel_pan[n  ] = 32 - sep;
		sigdata->channel_pan[n+1] = 32 + sep;
		sigdata->channel_pan[n+2] = 32 + sep;
		sigdata->channel_pan[n+3] = 32 - sep;
	}

    for ( n = 0; (unsigned)n < stream->chunk_count; ++n )
	{
		struct riff_chunk * c = stream->chunks + n;
		switch ( c->type )
		{
		case DUMB_ID( 'M', 'A', 'I', 'N' ):
            if ( dumbfile_seek( f, c->offset, DFS_SEEK_SET ) ) goto error_usd;
            dumbfile_getnc( (char *) sigdata->name, 64, f );
			sigdata->name[ 64 ] = 0;
			sigdata->flags = IT_STEREO | IT_OLD_EFFECTS | IT_COMPATIBLE_GXX | IT_WAS_AN_S3M;
            o = dumbfile_getc( f );
            if ( ! ( o & 1 ) ) sigdata->flags |= IT_LINEAR_SLIDES;
            if ( ( o & ~3 ) || ! ( o & 2 ) ) goto error_usd; // unknown flags
            sigdata->n_pchannels = dumbfile_getc( f );
            sigdata->speed = dumbfile_getc( f );
            sigdata->tempo = dumbfile_getc( f );

            dumbfile_skip( f, 4 );

            sigdata->global_volume = dumbfile_getc( f );

            if ( c->size < 0x48 + (unsigned)sigdata->n_pchannels ) goto error_usd;

			for ( o = 0; o < sigdata->n_pchannels; ++o )
			{
                p = dumbfile_getc( f );
                sigdata->channel_pan[ o ] = p;
                if ( p >= 128 )
				{
					sigdata->channel_volume[ o ] = 0;
				}
			}
			break;
		}
	}

	sigdata->pattern = malloc( sigdata->n_patterns * sizeof( *sigdata->pattern ) );
	if ( ! sigdata->pattern ) goto error_usd;
	for ( n = 0; n < sigdata->n_patterns; ++n )
		sigdata->pattern[ n ].entry = NULL;

	sigdata->sample = malloc( sigdata->n_samples * sizeof( *sigdata->sample ) );
	if ( ! sigdata->sample ) goto error_usd;
	for ( n = 0; n < sigdata->n_samples; ++n )
	{
		IT_SAMPLE * sample = sigdata->sample + n;
		sample->data = NULL;
		sample->flags = 0;
		sample->name[ 0 ] = 0;
	}

    for ( n = 0; (unsigned)n < stream->chunk_count; ++n )
	{
		struct riff_chunk * c = stream->chunks + n;
		switch ( c->type )
		{
		case DUMB_ID( 'O', 'R', 'D', 'R' ):
            if ( dumbfile_seek( f, c->offset, DFS_SEEK_SET ) ) goto error_usd;
            sigdata->n_orders = dumbfile_getc( f ) + 1;
            if ( (unsigned)sigdata->n_orders + 1 > c->size ) goto error_usd;
			sigdata->order = malloc( sigdata->n_orders );
			if ( ! sigdata->order ) goto error_usd;
            dumbfile_getnc( (char *) sigdata->order, sigdata->n_orders, f );
			break;

		case DUMB_ID( 'P', 'A', 'T', 'T' ):
            if ( dumbfile_seek( f, c->offset, DFS_SEEK_SET ) ) goto error_usd;
            o = dumbfile_getc( f );
            p = dumbfile_igetl( f );
            if ( it_riff_am_process_pattern( sigdata->pattern + o, f, p, 0 ) ) goto error_usd;
			break;

		case DUMB_ID( 'I', 'N', 'S', 'T' ):
			{
				IT_SAMPLE * sample;
                if ( dumbfile_seek( f, c->offset + 1, DFS_SEEK_SET ) ) goto error_usd;
                sample = sigdata->sample + dumbfile_getc( f );
                if ( c->size >= 0x121 )
                {
                    if ( dumbfile_seek( f, c->offset + 0xE1, DFS_SEEK_SET ) ) goto error_usd;
                    if ( dumbfile_mgetl( f ) == DUMB_ID('S','A','M','P') )
                    {
                        unsigned size = dumbfile_igetl( f );
                        if ( it_riff_am_process_sample( sample, f, size, 0 ) ) goto error_usd;
                        break;
                    }
				}
                dumbfile_seek( f, c->offset + 2, DFS_SEEK_SET );
                dumbfile_getnc( (char *) sample->name, 28, f );
                sample->name[ 28 ] = 0;
            }
			break;
		}
	}

	_dumb_it_fix_invalid_orders( sigdata );

	return sigdata;

error_usd:
	_dumb_it_unload_sigdata( sigdata );
	goto error;
error_sd:
	free( sigdata );
error:
	return NULL;
}